

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O3

uint32_t anon_unknown.dwarf_5956205::DecodeBits
                   (const_iterator *bitpos,const_iterator *endpos,uint8_t minval,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *bit_sizes)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  byte *pbVar7;
  ulong *puVar8;
  uint uVar9;
  byte *pbVar10;
  char cVar11;
  long in_FS_OFFSET;
  bool bVar12;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar10 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pbVar7 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar7) {
    uVar4 = (uint)minval;
    do {
      pbVar1 = pbVar10 + 1;
      if (pbVar1 == pbVar7) {
LAB_00df45de:
        if (*pbVar10 == 0) goto LAB_00df45c8;
        puVar8 = (bitpos->super__Bit_iterator_base)._M_p;
        uVar6 = (bitpos->super__Bit_iterator_base)._M_offset;
        uVar9 = 0;
        cVar11 = -1;
        goto LAB_00df45f3;
      }
      puVar8 = (bitpos->super__Bit_iterator_base)._M_p;
      uVar6 = (bitpos->super__Bit_iterator_base)._M_offset;
      if ((puVar8 == (endpos->super__Bit_iterator_base)._M_p) &&
         (uVar6 == (endpos->super__Bit_iterator_base)._M_offset)) break;
      uVar3 = *puVar8;
      (bitpos->super__Bit_iterator_base)._M_offset = uVar6 + 1;
      if (uVar6 == 0x3f) {
        (bitpos->super__Bit_iterator_base)._M_offset = 0;
        (bitpos->super__Bit_iterator_base)._M_p = puVar8 + 1;
      }
      if ((1L << ((byte)uVar6 & 0x3f) & uVar3) == 0) goto LAB_00df45de;
      uVar4 = uVar4 + (1 << (*pbVar10 & 0x1f));
      pbVar7 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pbVar10 = pbVar1;
    } while (pbVar1 != pbVar7);
  }
LAB_00df45c3:
  uVar4 = 0xffffffff;
LAB_00df45c8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return uVar4;
  while( true ) {
    bVar5 = (byte)uVar6;
    uVar3 = *puVar8;
    (bitpos->super__Bit_iterator_base)._M_offset = uVar6 + 1;
    bVar12 = uVar6 == 0x3f;
    uVar6 = uVar6 + 1;
    if (bVar12) {
      (bitpos->super__Bit_iterator_base)._M_offset = 0;
      puVar8 = puVar8 + 1;
      (bitpos->super__Bit_iterator_base)._M_p = puVar8;
      uVar6 = 0;
    }
    uVar4 = uVar4 + ((uint)((1L << (bVar5 & 0x3f) & uVar3) != 0) << (cVar11 + *pbVar10 & 0x1f));
    uVar9 = uVar9 + 1;
    cVar11 = cVar11 + -1;
    if (*pbVar10 <= uVar9) break;
LAB_00df45f3:
    if ((puVar8 == (endpos->super__Bit_iterator_base)._M_p) &&
       (uVar6 == (endpos->super__Bit_iterator_base)._M_offset)) goto LAB_00df45c3;
  }
  goto LAB_00df45c8;
}

Assistant:

uint32_t DecodeBits(std::vector<bool>::const_iterator& bitpos, const std::vector<bool>::const_iterator& endpos, uint8_t minval, const std::vector<uint8_t> &bit_sizes)
{
    uint32_t val = minval;
    bool bit;
    for (std::vector<uint8_t>::const_iterator bit_sizes_it = bit_sizes.begin();
        bit_sizes_it != bit_sizes.end(); ++bit_sizes_it) {
        if (bit_sizes_it + 1 != bit_sizes.end()) {
            if (bitpos == endpos) break;
            bit = *bitpos;
            bitpos++;
        } else {
            bit = 0;
        }
        if (bit) {
            val += (1 << *bit_sizes_it);
        } else {
            for (int b = 0; b < *bit_sizes_it; b++) {
                if (bitpos == endpos) return INVALID; // Reached EOF in mantissa
                bit = *bitpos;
                bitpos++;
                val += bit << (*bit_sizes_it - 1 - b);
            }
            return val;
        }
    }
    return INVALID; // Reached EOF in exponent
}